

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O2

ze_result_t __thiscall
loader::context_t::init_driver
          (context_t *this,driver_t *driver,ze_init_flags_t flags,ze_init_driver_type_desc_t *desc,
          ze_global_dditable_t *globalInitStored,zes_global_dditable_t *sysmanGlobalInitStored,
          bool sysmanOnly)

{
  ze_result_t zVar1;
  uint uVar2;
  ze_result_t zVar3;
  code *pcVar4;
  ze_result_t result;
  ze_result_t result_00;
  ze_result_t result_01;
  ze_init_flags_t flags_00;
  ze_result_t result_02;
  ze_init_flags_t flags_01;
  ze_result_t result_03;
  ze_result_t result_04;
  ze_result_t result_05;
  ze_result_t result_06;
  ze_init_driver_type_desc_t *desc_00;
  string *psVar5;
  zes_global_dditable_t global;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  uint32_t local_258;
  undefined4 uStack_254;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (sysmanOnly) {
    pcVar4 = (code *)dlsym(driver->handle,"zesGetGlobalProcAddrTable");
    if (pcVar4 != (code *)0x0) {
      uVar2 = (*pcVar4)(0x1000d,&local_258);
      if (uVar2 == 0) {
        if (CONCAT44(uStack_254,local_258) == 0) {
          if (this->debugTraceEnabled != true) {
            return ZE_RESULT_ERROR_UNINITIALIZED;
          }
          std::operator+(&local_2b8,"init driver ",&driver->name);
          std::operator+(&bStack_2d8,&local_2b8," failed, zesInit function pointer null. Returning "
                        );
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::string((string *)&local_d0,(string *)&bStack_2d8);
          to_string_abi_cxx11_(&local_f0,(loader *)0x78000001,result_06);
          debug_trace_message(this,&local_d0,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          psVar5 = &local_d0;
          goto LAB_001c6638;
        }
        zVar3 = (*sysmanGlobalInitStored->pfnInit)(flags);
        if (driver->initSysManStatus != ZE_RESULT_SUCCESS) {
          zVar3 = driver->initSysManStatus;
        }
        if (this->debugTraceEnabled != true) {
          return zVar3;
        }
        std::operator+(&local_250,"init driver ",&driver->name);
        std::operator+(&local_278,&local_250," zesInit(");
        to_string_abi_cxx11_(&local_298,(loader *)(ulong)flags,flags_01);
        std::operator+(&local_2b8,&local_278,&local_298);
        std::operator+(&bStack_2d8,&local_2b8,") returning ");
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::string((string *)&local_110,(string *)&bStack_2d8);
        to_string_abi_cxx11_(&local_130,(loader *)(ulong)zVar3,result_03);
        debug_trace_message(this,&local_110,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        psVar5 = &local_110;
      }
      else {
        zVar3 = ZE_RESULT_ERROR_UNINITIALIZED;
        if (this->debugTraceEnabled != true) {
          return ZE_RESULT_ERROR_UNINITIALIZED;
        }
        std::operator+(&local_2b8,"init driver ",&driver->name);
        std::operator+(&bStack_2d8,&local_2b8," failed, zesGetGlobalProcAddrTable() failed with ");
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::string((string *)&local_90,(string *)&bStack_2d8);
        to_string_abi_cxx11_(&local_b0,(loader *)(ulong)uVar2,result);
        debug_trace_message(this,&local_90,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        psVar5 = &local_90;
      }
LAB_001c658b:
      std::__cxx11::string::~string((string *)psVar5);
      std::__cxx11::string::~string((string *)&bStack_2d8);
      return zVar3;
    }
    if (this->debugTraceEnabled != true) {
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    std::operator+(&local_2b8,"init driver ",&driver->name);
    std::operator+(&bStack_2d8,&local_2b8,
                   " failed, zesGetGlobalProcAddrTable function pointer null. Returning ");
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::string((string *)&local_50,(string *)&bStack_2d8);
    to_string_abi_cxx11_(&local_70,(loader *)0x78000001,result_01);
    debug_trace_message(this,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    psVar5 = &local_50;
  }
  else if (desc == (ze_init_driver_type_desc_t *)0x0) {
    if (((driver->dditable).ze.Global.pfnInit != (ze_pfnInit_t)0x0) &&
       (globalInitStored->pfnInit != (ze_pfnInit_t)0x0)) {
      zVar3 = (*globalInitStored->pfnInit)(flags);
      zVar1 = driver->initStatus;
      if (zVar3 == ZE_RESULT_SUCCESS && zVar1 == ZE_RESULT_SUCCESS) {
        return ZE_RESULT_SUCCESS;
      }
      if (zVar1 != ZE_RESULT_SUCCESS) {
        zVar3 = zVar1;
      }
      if (this->debugTraceEnabled != true) {
        return zVar3;
      }
      std::operator+(&local_250,"init driver (global ddi) ",&driver->name);
      std::operator+(&local_278,&local_250," zeInit(");
      to_string_abi_cxx11_(&local_298,(loader *)(ulong)flags,flags_00);
      std::operator+(&local_2b8,&local_278,&local_298);
      std::operator+(&bStack_2d8,&local_2b8,") returning ");
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::string((string *)&local_190,(string *)&bStack_2d8);
      to_string_abi_cxx11_(&local_1b0,(loader *)(ulong)zVar3,result_02);
      debug_trace_message(this,&local_190,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&bStack_2d8);
      return zVar3;
    }
    if (this->debugTraceEnabled != true) {
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    std::operator+(&local_2b8,"init driver ",&driver->name);
    std::operator+(&bStack_2d8,&local_2b8," failed, zeInit function pointer null. Returning ");
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::string((string *)&local_150,(string *)&bStack_2d8);
    to_string_abi_cxx11_(&local_170,(loader *)0x78000001,result_04);
    debug_trace_message(this,&local_150,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    psVar5 = &local_150;
  }
  else {
    if (((driver->dditable).ze.Global.pfnInitDrivers != (ze_pfnInitDrivers_t)0x0) &&
       (globalInitStored->pfnInitDrivers != (ze_pfnInitDrivers_t)0x0)) {
      local_258 = 0;
      zVar3 = (*globalInitStored->pfnInitDrivers)(&local_258,(ze_driver_handle_t *)0x0,desc);
      zVar1 = driver->initDriversStatus;
      if (zVar3 == ZE_RESULT_SUCCESS && zVar1 == ZE_RESULT_SUCCESS) {
        return ZE_RESULT_SUCCESS;
      }
      if (zVar1 != ZE_RESULT_SUCCESS) {
        zVar3 = zVar1;
      }
      if (this->debugTraceEnabled != true) {
        return zVar3;
      }
      std::operator+(&local_250,"init driver (global ddi) ",&driver->name);
      std::operator+(&local_278,&local_250," zeInitDrivers(");
      to_string_abi_cxx11_(&local_298,(loader *)desc,desc_00);
      std::operator+(&local_2b8,&local_278,&local_298);
      std::operator+(&bStack_2d8,&local_2b8,") returning ");
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::string((string *)&local_210,(string *)&bStack_2d8);
      to_string_abi_cxx11_(&local_230,(loader *)(ulong)zVar3,result_05);
      debug_trace_message(this,&local_210,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      psVar5 = &local_210;
      goto LAB_001c658b;
    }
    if (this->debugTraceEnabled != true) {
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    std::operator+(&local_2b8,"init driver ",&driver->name);
    std::operator+(&bStack_2d8,&local_2b8,
                   " failed, pfnInitDrivers function pointer null. Returning ");
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::string((string *)&local_1d0,(string *)&bStack_2d8);
    to_string_abi_cxx11_(&local_1f0,(loader *)0x78000001,result_00);
    debug_trace_message(this,&local_1d0,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    psVar5 = &local_1d0;
  }
LAB_001c6638:
  std::__cxx11::string::~string((string *)psVar5);
  std::__cxx11::string::~string((string *)&bStack_2d8);
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

ze_result_t context_t::init_driver(driver_t &driver, ze_init_flags_t flags, ze_init_driver_type_desc_t* desc, ze_global_dditable_t *globalInitStored, zes_global_dditable_t *sysmanGlobalInitStored, bool sysmanOnly) {
        if (sysmanOnly) {
            auto getTable = reinterpret_cast<zes_pfnGetGlobalProcAddrTable_t>(
                GET_FUNCTION_PTR(driver.handle, "zesGetGlobalProcAddrTable"));
            if(!getTable) {
                if (debugTraceEnabled) {
                    std::string errorMessage = "init driver " + driver.name + " failed, zesGetGlobalProcAddrTable function pointer null. Returning ";
                    debug_trace_message(errorMessage, loader::to_string(ZE_RESULT_ERROR_UNINITIALIZED));
                }
                return ZE_RESULT_ERROR_UNINITIALIZED;
            }

            zes_global_dditable_t global;
            auto getTableResult = getTable(ZE_API_VERSION_CURRENT, &global);
            if(getTableResult != ZE_RESULT_SUCCESS) {
                if (debugTraceEnabled) {
                    std::string errorMessage = "init driver " + driver.name + " failed, zesGetGlobalProcAddrTable() failed with ";
                    debug_trace_message(errorMessage, loader::to_string(getTableResult));
                }
                return ZE_RESULT_ERROR_UNINITIALIZED;
            }

            if(nullptr == global.pfnInit) {
                if (debugTraceEnabled) {
                    std::string errorMessage = "init driver " + driver.name + " failed, zesInit function pointer null. Returning ";
                    debug_trace_message(errorMessage, loader::to_string(ZE_RESULT_ERROR_UNINITIALIZED));
                }
                return ZE_RESULT_ERROR_UNINITIALIZED;
            }

            // Use the previously init ddi table pointer to zesInit to allow for intercept of the zesInit calls
            ze_result_t res = sysmanGlobalInitStored->pfnInit(flags);
            // Verify that this driver successfully init in the call above.
            if (driver.initSysManStatus != ZE_RESULT_SUCCESS) {
                res = driver.initSysManStatus;
            }
            if (debugTraceEnabled) {
                std::string message = "init driver " + driver.name + " zesInit(" + loader::to_string(flags) + ") returning ";
                debug_trace_message(message, loader::to_string(res));
            }
            return res;
        } else {
            if (!desc) {
                auto pfnInit = driver.dditable.ze.Global.pfnInit;
                if(nullptr == pfnInit || globalInitStored->pfnInit == nullptr) {
                    if (debugTraceEnabled) {
                        std::string errorMessage = "init driver " + driver.name + " failed, zeInit function pointer null. Returning ";
                        debug_trace_message(errorMessage, loader::to_string(ZE_RESULT_ERROR_UNINITIALIZED));
                    }
                    return ZE_RESULT_ERROR_UNINITIALIZED;
                }

                // Use the previously init ddi table pointer to zeInit to allow for intercept of the zeInit calls
                ze_result_t res = globalInitStored->pfnInit(flags);
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS || driver.initStatus != ZE_RESULT_SUCCESS) {
                    if (driver.initStatus != ZE_RESULT_SUCCESS)
                        res = driver.initStatus;
                    if (debugTraceEnabled) {
                        std::string message = "init driver (global ddi) " + driver.name + " zeInit(" + loader::to_string(flags) + ") returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    return res;
                }
            } else {
                auto pfnInitDrivers = driver.dditable.ze.Global.pfnInitDrivers;
                if(nullptr == pfnInitDrivers || globalInitStored->pfnInitDrivers == nullptr) {
                    if (debugTraceEnabled) {
                        std::string errorMessage = "init driver " + driver.name + " failed, pfnInitDrivers function pointer null. Returning ";
                        debug_trace_message(errorMessage, loader::to_string(ZE_RESULT_ERROR_UNINITIALIZED));
                    }
                    return ZE_RESULT_ERROR_UNINITIALIZED;
                }

                uint32_t pCount = 0;
                // Use the previously init ddi table pointer to zeInitDrivers to allow for intercept of the zeInitDrivers calls
                ze_result_t res = globalInitStored->pfnInitDrivers(&pCount, nullptr, desc);
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS || driver.initDriversStatus != ZE_RESULT_SUCCESS) {
                    if (driver.initDriversStatus != ZE_RESULT_SUCCESS)
                        res = driver.initDriversStatus;
                    if (debugTraceEnabled) {
                        std::string message = "init driver (global ddi) " + driver.name + " zeInitDrivers(" + loader::to_string(desc) + ") returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    return res;
                }
            }
            return ZE_RESULT_SUCCESS;
        }
    }